

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O2

void __thiscall
Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>::Polynom
          (Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_> *this,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *summands)

{
  initializer_list<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_> cont;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> local_40;
  
  if (summands->_cursor != summands->_stack) {
    Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Stack
              (&this->_summands,summands);
    return;
  }
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::zero();
  cont._M_len = 1;
  cont._M_array = &local_40;
  Lib::Stack<Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::Stack
            (&this->_summands,cont);
  RationalConstantType::~RationalConstantType(&local_40.numeral);
  return;
}

Assistant:

Polynom<Number>::Polynom(Stack<Monom>&& summands) 
  : _summands(
      summands.isEmpty() 
        ? Stack<Monom>{Monom::zero()} 
        : std::move(summands)) 
{ /* integrity(); */ }